

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexSubImageCubeEmptyTexCase::createTexture
          (TexSubImageCubeEmptyTexCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 format;
  deUint32 type;
  deUint32 dVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int ndx;
  int level;
  float fVar8;
  deUint32 tex;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  Vec4 gMax;
  Vec4 gMin;
  TextureLevel data;
  Random rnd;
  PixelBufferAccess local_58;
  
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&(this->super_TextureCubeSpecCase).m_texFormat);
  dVar3 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  if (0 < (this->super_TextureCubeSpecCase).m_numLevels) {
    level = 0;
    do {
      iVar6 = (this->super_TextureCubeSpecCase).m_size >> ((byte)level & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      lVar7 = 0;
      do {
        sglr::ContextWrapper::glTexImage2D
                  (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar7),level,this->m_internalFormat
                   ,iVar6,iVar6,0,this->m_format,this->m_dataType,(void *)0x0);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x18);
      level = level + 1;
      iVar6 = (this->super_TextureCubeSpecCase).m_numLevels;
    } while (level < iVar6);
    if (0 < iVar6) {
      uVar4 = 0;
      lVar7 = local_d0;
      do {
        local_d0 = lVar7;
        uVar5 = (this->super_TextureCubeSpecCase).m_size >> ((byte)uVar4 & 0x1f);
        if ((int)uVar5 < 2) {
          uVar5 = 1;
        }
        local_c0 = (ulong)uVar5;
        local_c8 = uVar4;
        tcu::TextureLevel::setSize(&data,uVar5,uVar5,1);
        local_d0 = 0;
        do {
          gMin.m_data[0] = 0.0;
          gMin.m_data[1] = 0.0;
          gMin.m_data[2] = 0.0;
          gMin.m_data[3] = 0.0;
          lVar7 = 0;
          do {
            fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar7];
            fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar7];
            fVar8 = deRandom_getFloat(&rnd.m_rnd);
            gMin.m_data[lVar7] = (fVar2 - fVar1) * fVar8 + fVar1;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          gMax.m_data[0] = 0.0;
          gMax.m_data[1] = 0.0;
          gMax.m_data[2] = 0.0;
          gMax.m_data[3] = 0.0;
          lVar7 = 0;
          do {
            fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar7];
            fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar7];
            fVar8 = deRandom_getFloat(&rnd.m_rnd);
            gMax.m_data[lVar7] = (fVar2 - fVar1) * fVar8 + fVar1;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          tcu::TextureLevel::getAccess(&local_58,&data);
          tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
          dVar3 = (&s_cubeMapFaces)[local_d0];
          format = this->m_format;
          type = this->m_dataType;
          tcu::TextureLevel::getAccess(&local_58,&data);
          sglr::ContextWrapper::glTexSubImage2D
                    (this_00,dVar3,(int)local_c8,0,0,(int)local_c0,(int)local_c0,format,type,
                     local_58.super_ConstPixelBufferAccess.m_data);
          local_d0 = local_d0 + 1;
        } while (local_d0 != 6);
        uVar5 = (int)local_c8 + 1;
        uVar4 = (ulong)uVar5;
        local_d0 = 6;
        lVar7 = 6;
      } while ((int)uVar5 < (this->super_TextureCubeSpecCase).m_numLevels);
    }
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Specify storage for each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify data using glTexSubImage2D()
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			data.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, 0, 0, levelSize, levelSize, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}